

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-history.c
# Opt level: O1

void history_lose_artifact(player *p,artifact *artifact)

{
  size_t sVar1;
  history_info *phVar2;
  long lVar3;
  long lVar4;
  artifact *in_RDX;
  artifact *extraout_RDX;
  long lVar5;
  bitflag flags [2];
  char text [80];
  char o_name [80];
  bitflag local_ca [2];
  char local_c8 [80];
  char local_78 [80];
  
  if (artifact == (artifact *)0x0) {
    __assert_fail("artifact != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-history.c"
                  ,0xf8,"void history_lose_artifact(struct player *, const struct artifact *)");
  }
  sVar1 = (p->hist).next;
  lVar5 = sVar1 + 1;
  lVar3 = sVar1 * 0x5c;
  do {
    lVar4 = lVar3;
    lVar5 = lVar5 + -1;
    if (lVar5 == 0) goto LAB_001a51b2;
    phVar2 = (p->hist).entries;
    lVar3 = lVar4 + -0x5c;
  } while (artifact->aidx != (uint)phVar2->type[lVar4 + -0x56]);
  flag_on_dbg(phVar2[-1].type + lVar4,2,4,"h->entries[i].type","HIST_ARTIFACT_LOST");
  in_RDX = extraout_RDX;
  if (lVar5 == 0) {
LAB_001a51b2:
    get_artifact_name(local_78,(size_t)artifact,in_RDX);
    strnfmt(local_c8,0x50,"Missed %s",local_78);
    flag_wipe(local_ca,2);
    flag_on_dbg(local_ca,2,2,"flags","HIST_ARTIFACT_UNKNOWN");
    flag_on_dbg(local_ca,2,4,"flags","HIST_ARTIFACT_LOST");
    history_add_full(p,local_ca,artifact->aidx,(int)p->depth,(int)p->lev,p->total_energy / 100,
                     local_c8);
  }
  return;
}

Assistant:

void history_lose_artifact(struct player *p, const struct artifact *artifact)
{
	assert(artifact != NULL);

	/* Try to mark it as lost if it's already in history */
	if (!history_mark_artifact_lost(&p->hist, artifact)) {
		/* Otherwise add a new entry */
		char o_name[80];
		char text[80];

		get_artifact_name(o_name, sizeof(o_name), artifact);
		strnfmt(text, sizeof(text), "Missed %s", o_name);

		bitflag flags[HIST_SIZE];
		hist_wipe(flags);
		hist_on(flags, HIST_ARTIFACT_UNKNOWN);
		hist_on(flags, HIST_ARTIFACT_LOST);

		history_add_with_flags(p, text, flags, artifact);
	}
}